

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# postgres_parser.cpp
# Opt level: O1

void __thiscall duckdb::PostgresParser::~PostgresParser(PostgresParser *this)

{
  pointer pcVar1;
  
  duckdb_libpgquery::pg_parser_cleanup();
  pcVar1 = (this->error_message)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->error_message).field_2) {
    operator_delete(pcVar1);
    return;
  }
  return;
}

Assistant:

PostgresParser::~PostgresParser()  {
    duckdb_libpgquery::pg_parser_cleanup();
}